

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

void Hacl_Impl_Ed25519_PointAdd_point_add(uint64_t *out,uint64_t *p,uint64_t *q1)

{
  uint64_t local_148;
  uint64_t uStack_140;
  uint64_t local_138;
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t uStack_118;
  uint64_t local_110;
  uint64_t uStack_108;
  uint64_t local_100;
  uint64_t local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  long local_d8;
  uint64_t local_d0;
  long lStack_c8;
  long local_c0;
  long lStack_b8;
  long local_b0;
  uint64_t local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  uint64_t local_80;
  uint64_t uStack_78;
  uint64_t local_70;
  uint64_t uStack_68;
  uint64_t local_60;
  uint64_t local_58 [5];
  
  local_128 = p[4];
  local_148 = *p;
  uStack_140 = p[1];
  local_138 = p[2];
  uStack_130 = p[3];
  memset(&local_f8,0,0xa0);
  local_120 = *q1;
  uStack_118 = q1[1];
  local_110 = q1[2];
  uStack_108 = q1[3];
  local_100 = q1[4];
  Hacl_Bignum25519_fdifference_reduced(&local_148,p + 5);
  Hacl_Bignum25519_fdifference(&local_120,q1 + 5);
  Hacl_Bignum_Fmul_fmul(&local_f8,&local_148,&local_120);
  local_128 = p[9];
  local_148 = p[5];
  uStack_140 = p[6];
  local_138 = p[7];
  uStack_130 = p[8];
  local_120 = q1[5];
  uStack_118 = q1[6];
  local_110 = q1[7];
  uStack_108 = q1[8];
  local_100 = q1[9];
  Hacl_Bignum25519_fsum(&local_148,p);
  Hacl_Bignum25519_fsum(&local_120,q1);
  Hacl_Bignum_Fmul_fmul(&local_d0,&local_148,&local_120);
  local_58[0] = 0x69b9426b2f159;
  local_58[1] = 0x35050762add7a;
  local_58[2] = 0x3cf44c0038052;
  local_58[3] = 0x6738cc7407977;
  local_58[4] = 0x2406d9dc56dff;
  Hacl_Bignum_Fmul_fmul(&local_148,p + 0xf,local_58);
  Hacl_Bignum_Fmul_fmul(&local_120,&local_148,q1 + 0xf);
  local_128 = p[0xe] * 2;
  local_148 = p[10] * 2;
  uStack_140 = p[0xb] * 2;
  local_138 = p[0xc] * 2;
  uStack_130 = p[0xd] * 2;
  Hacl_Bignum_Fmul_fmul(&local_a8,&local_148,q1 + 10);
  local_128 = local_d8;
  local_138 = local_e8;
  uStack_130 = lStack_e0;
  local_148 = local_f8;
  uStack_140 = lStack_f0;
  local_80 = local_120;
  uStack_78 = uStack_118;
  local_70 = local_110;
  uStack_68 = uStack_108;
  local_60 = local_100;
  Hacl_Bignum25519_fdifference_reduced(&local_148,&local_d0);
  Hacl_Bignum25519_fdifference(&local_80,&local_a8);
  local_a8 = local_120 + local_a8;
  lStack_a0 = uStack_118 + lStack_a0;
  local_98 = local_110 + local_98;
  lStack_90 = uStack_108 + lStack_90;
  local_88 = local_88 + local_100;
  local_d0 = local_d0 + local_f8;
  lStack_c8 = lStack_c8 + lStack_f0;
  local_c0 = local_c0 + local_e8;
  lStack_b8 = lStack_b8 + lStack_e0;
  local_b0 = local_b0 + local_d8;
  Hacl_Bignum_Fmul_fmul(out,&local_148,&local_80);
  Hacl_Bignum_Fmul_fmul(out + 5,&local_a8,&local_d0);
  Hacl_Bignum_Fmul_fmul(out + 0xf,&local_148,&local_d0);
  Hacl_Bignum_Fmul_fmul(out + 10,&local_a8,&local_80);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_PointAdd_point_add(uint64_t *out, uint64_t *p, uint64_t *q1)
{
  uint64_t tmp[30U] = { 0U };
  uint64_t *tmp1 = tmp;
  uint64_t *tmp20 = tmp + (uint32_t)5U;
  uint64_t *tmp30 = tmp + (uint32_t)10U;
  uint64_t *tmp40 = tmp + (uint32_t)15U;
  uint64_t *x1 = Hacl_Impl_Ed25519_ExtPoint_getx(p);
  uint64_t *y1 = Hacl_Impl_Ed25519_ExtPoint_gety(p);
  uint64_t *x2 = Hacl_Impl_Ed25519_ExtPoint_getx(q1);
  uint64_t *y2 = Hacl_Impl_Ed25519_ExtPoint_gety(q1);
  memcpy(tmp1, x1, (uint32_t)5U * sizeof x1[0U]);
  memcpy(tmp20, x2, (uint32_t)5U * sizeof x2[0U]);
  Hacl_Bignum25519_fdifference_reduced(tmp1, y1);
  Hacl_Bignum25519_fdifference(tmp20, y2);
  Hacl_Bignum25519_fmul(tmp30, tmp1, tmp20);
  memcpy(tmp1, y1, (uint32_t)5U * sizeof y1[0U]);
  memcpy(tmp20, y2, (uint32_t)5U * sizeof y2[0U]);
  Hacl_Bignum25519_fsum(tmp1, x1);
  Hacl_Bignum25519_fsum(tmp20, x2);
  Hacl_Bignum25519_fmul(tmp40, tmp1, tmp20);
  uint64_t *tmp10 = tmp;
  uint64_t *tmp21 = tmp + (uint32_t)5U;
  uint64_t *tmp31 = tmp + (uint32_t)10U;
  uint64_t *tmp50 = tmp + (uint32_t)20U;
  uint64_t *tmp60 = tmp + (uint32_t)25U;
  uint64_t *z1 = Hacl_Impl_Ed25519_ExtPoint_getz(p);
  uint64_t *t1 = Hacl_Impl_Ed25519_ExtPoint_gett(p);
  uint64_t *z2 = Hacl_Impl_Ed25519_ExtPoint_getz(q1);
  uint64_t *t2 = Hacl_Impl_Ed25519_ExtPoint_gett(q1);
  Hacl_Bignum25519_times_2d(tmp10, t1);
  Hacl_Bignum25519_fmul(tmp21, tmp10, t2);
  Hacl_Bignum25519_times_2(tmp10, z1);
  Hacl_Bignum25519_fmul(tmp50, tmp10, z2);
  memcpy(tmp10, tmp31, (uint32_t)5U * sizeof tmp31[0U]);
  memcpy(tmp60, tmp21, (uint32_t)5U * sizeof tmp21[0U]);
  uint64_t *tmp11 = tmp;
  uint64_t *tmp2 = tmp + (uint32_t)5U;
  uint64_t *tmp3 = tmp + (uint32_t)10U;
  uint64_t *tmp41 = tmp + (uint32_t)15U;
  uint64_t *tmp51 = tmp + (uint32_t)20U;
  uint64_t *tmp61 = tmp + (uint32_t)25U;
  Hacl_Bignum25519_fdifference_reduced(tmp11, tmp41);
  Hacl_Bignum25519_fdifference(tmp61, tmp51);
  Hacl_Bignum25519_fsum(tmp51, tmp2);
  Hacl_Bignum25519_fsum(tmp41, tmp3);
  uint64_t *tmp12 = tmp;
  uint64_t *tmp4 = tmp + (uint32_t)15U;
  uint64_t *tmp5 = tmp + (uint32_t)20U;
  uint64_t *tmp6 = tmp + (uint32_t)25U;
  uint64_t *x3 = Hacl_Impl_Ed25519_ExtPoint_getx(out);
  uint64_t *y3 = Hacl_Impl_Ed25519_ExtPoint_gety(out);
  uint64_t *z3 = Hacl_Impl_Ed25519_ExtPoint_getz(out);
  uint64_t *t3 = Hacl_Impl_Ed25519_ExtPoint_gett(out);
  Hacl_Bignum25519_fmul(x3, tmp12, tmp6);
  Hacl_Bignum25519_fmul(y3, tmp5, tmp4);
  Hacl_Bignum25519_fmul(t3, tmp12, tmp4);
  Hacl_Bignum25519_fmul(z3, tmp5, tmp6);
}